

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADABUMathQuaternion.cpp
# Opt level: O0

Quaternion *
COLLADABU::Math::Quaternion::nlerp(Real fT,Quaternion *rkP,Quaternion *rkQ,bool shortestPath)

{
  byte in_CL;
  Quaternion *in_RDX;
  Quaternion *in_RSI;
  Quaternion *in_RDI;
  Quaternion *in_XMM0_Qa;
  Real fCos;
  Quaternion *result;
  Quaternion *in_stack_fffffffffffffeb8;
  Quaternion *in_stack_fffffffffffffec0;
  Quaternion *in_stack_fffffffffffffec8;
  Quaternion *in_stack_fffffffffffffef0;
  Quaternion local_d0 [4];
  Quaternion local_50;
  Real local_30;
  byte local_21;
  Quaternion *local_20;
  Quaternion *local_18;
  Quaternion *local_10;
  
  local_21 = in_CL & 1;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_XMM0_Qa;
  Quaternion(in_RDI,1.0,0.0,0.0,0.0);
  local_30 = dot(local_18,local_20);
  if ((0.0 <= local_30) || ((local_21 & 1) == 0)) {
    operator-(local_18,local_10);
    Math::operator*((Real)local_18,local_10);
    operator+(local_18,local_10);
    operator=(in_RDI,local_d0);
  }
  else {
    operator-(in_stack_fffffffffffffeb8);
    operator-(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    Math::operator*((Real)in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    operator+(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    operator=(in_RDI,&local_50);
  }
  normalise(in_stack_fffffffffffffef0);
  return in_RDI;
}

Assistant:

Quaternion Quaternion::nlerp( Real fT, const Quaternion& rkP,
                                      const Quaternion& rkQ, bool shortestPath )
        {
            Quaternion result;
            Real fCos = rkP.dot( rkQ );

            if ( fCos < 0.0f && shortestPath )
            {
                result = rkP + fT * ( ( -rkQ ) - rkP );
            }

            else
            {
                result = rkP + fT * ( rkQ - rkP );
            }

            result.normalise();
            return result;
        }